

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void __thiscall lda::expdigammify(lda *this,vw *all,float *gamma)

{
  lda_math_mode lVar1;
  ostream *poVar2;
  
  lVar1 = this->mmode;
  if (lVar1 == USE_SIMD) {
    ldamath::vexpdigammify(all,gamma,1e-10);
    return;
  }
  if (lVar1 != USE_PRECISE) {
    if (lVar1 == USE_FAST_APPROX) {
      ldamath::expdigammify<float,(lda_math_mode)2>(all,gamma,1e-10,0.0);
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "lda::expdigammify: Trampled or invalid math mode, aborting");
    std::endl<char,std::char_traits<char>>(poVar2);
    abort();
  }
  ldamath::expdigammify<float,(lda_math_mode)1>(all,gamma,1e-10,0.0);
  return;
}

Assistant:

void lda::expdigammify(vw &all, float *gamma)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      ldamath::expdigammify<float, USE_FAST_APPROX>(all, gamma, underflow_threshold(), 0.0f);
      break;
    case USE_PRECISE:
      ldamath::expdigammify<float, USE_PRECISE>(all, gamma, underflow_threshold(), 0.0f);
      break;
    case USE_SIMD:
      ldamath::expdigammify<float, USE_SIMD>(all, gamma, underflow_threshold(), 0.0f);
      break;
    default:
      std::cerr << "lda::expdigammify: Trampled or invalid math mode, aborting" << std::endl;
      abort();
  }
}